

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetNestedMessageName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Descriptor *descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this == (_anonymous_namespace_ *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_30);
  }
  else {
    StripPrefixString(__return_storage_ptr__,*(string **)(this + 8),
                      *(string **)(*(long *)(this + 0x10) + 8));
    if ((__return_storage_ptr__->_M_string_length != 0) &&
       (*(__return_storage_ptr__->_M_dataplus)._M_p != '.')) {
      std::operator+(&local_30,".",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string GetNestedMessageName(const Descriptor* descriptor) {
  if (descriptor == NULL) {
    return "";
  }
  string result =
      StripPrefixString(descriptor->full_name(), descriptor->file()->package());
  // Add a leading dot if one is not already present.
  if (!result.empty() && result[0] != '.') {
    result = "." + result;
  }
  return result;
}